

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t param_2)

{
  int iVar1;
  Dim DVar2;
  long lVar3;
  SPIRType *pSVar4;
  long *plVar5;
  runtime_error *this_00;
  char *pcVar6;
  size_type *psVar7;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Alloc_hider local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (type->image).type.id);
  local_60 = 0;
  local_58 = '\0';
  iVar1 = *(int *)&(pSVar4->super_IVariant).field_0xc;
  local_68._M_p = &local_58;
  if (iVar1 == 8) {
    pcVar6 = "u";
  }
  else {
    if (iVar1 != 7) goto LAB_0025ebe3;
    pcVar6 = "i";
  }
  ::std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)pcVar6);
LAB_0025ebe3:
  if ((type->image).dim == DimSubpassData && *(int *)&(type->super_IVariant).field_0xc == 0x10) {
    local_48[0] = local_38;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_68._M_p,local_68._M_p + local_60);
    ::std::__cxx11::string::append((char *)local_48);
    plVar5 = (long *)::std::__cxx11::string::append((char *)local_48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar7) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&local_68);
    DVar2 = (type->image).dim;
    if ((DimSubpassData < DVar2) || ((0x6fU >> (DVar2 & 0x1f) & 1) == 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.","");
      ::std::runtime_error::runtime_error(this_00,(string *)local_48);
      *(undefined ***)this_00 = &PTR__runtime_error_003fce08;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)&local_68);
    if ((type->image).ms == true) {
      ::std::__cxx11::string::append((char *)&local_68);
    }
    if ((type->image).arrayed == true) {
      ::std::__cxx11::string::append((char *)&local_68);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_68._M_p == &local_58) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_68._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_57,local_58);
    }
    __return_storage_ptr__->_M_string_length = local_60;
    local_60 = 0;
    local_58 = '\0';
    local_68._M_p = &local_58;
  }
  if (local_68._M_p != &local_58) {
    operator_delete(local_68._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t /*id*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";

	return res;
}